

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

void pax_time(char *p,int64_t *ps,long *pn)

{
  bool bVar1;
  int64_t last_digit_limit;
  int64_t limit;
  wchar_t sign;
  unsigned_long l;
  int64_t s;
  char digit;
  long *pn_local;
  int64_t *ps_local;
  char *p_local;
  
  s = 0;
  sign = L'\x01';
  p_local = p;
  if (*p == '-') {
    sign = L'\xffffffff';
    p_local = p + 1;
  }
  while( true ) {
    bVar1 = false;
    if ('/' < *p_local) {
      bVar1 = *p_local < ':';
    }
    if (!bVar1) goto LAB_001521e8;
    if ((0xccccccccccccccc < s) || ((s == 0xccccccccccccccc && ('\a' < (char)(*p_local + -0x30)))))
    break;
    s = s * 10 + (long)(char)(*p_local + -0x30);
    p_local = p_local + 1;
  }
  s = 0x7fffffffffffffff;
LAB_001521e8:
  *ps = s * sign;
  *pn = 0;
  if (*p_local == '.') {
    l = 100000000;
    do {
      p_local = p_local + 1;
      if (*p_local < '0') {
        return;
      }
      if ('9' < *p_local) {
        return;
      }
      *pn = (long)(*p_local + -0x30) * l + *pn;
      l = l / 10;
    } while (l != 0);
  }
  return;
}

Assistant:

static void
pax_time(const char *p, int64_t *ps, long *pn)
{
	char digit;
	int64_t	s;
	unsigned long l;
	int sign;
	int64_t limit, last_digit_limit;

	limit = INT64_MAX / 10;
	last_digit_limit = INT64_MAX % 10;

	s = 0;
	sign = 1;
	if (*p == '-') {
		sign = -1;
		p++;
	}
	while (*p >= '0' && *p <= '9') {
		digit = *p - '0';
		if (s > limit ||
		    (s == limit && digit > last_digit_limit)) {
			s = INT64_MAX;
			break;
		}
		s = (s * 10) + digit;
		++p;
	}

	*ps = s * sign;

	/* Calculate nanoseconds. */
	*pn = 0;

	if (*p != '.')
		return;

	l = 100000000UL;
	do {
		++p;
		if (*p >= '0' && *p <= '9')
			*pn += (*p - '0') * l;
		else
			break;
	} while (l /= 10);
}